

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlFARegExecSave(xmlRegExecCtxtPtr exec)

{
  uint uVar1;
  int iVar2;
  xmlRegExecRollback *pxVar3;
  int *__dest;
  int len;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  if (10000000 < exec->nbPush) {
    exec->status = -6;
    return;
  }
  exec->nbPush = exec->nbPush + 1;
  uVar1 = exec->maxRollbacks;
  iVar4 = exec->nbRollbacks;
  if (iVar4 < (int)uVar1) {
LAB_00174d2e:
    pxVar3 = exec->rollbacks;
    pxVar3[iVar4].state = exec->state;
    pxVar3[iVar4].index = exec->index;
    pxVar3[iVar4].nextbranch = exec->transno + 1;
    iVar2 = exec->comp->nbCounters;
    if (0 < (long)iVar2) {
      __dest = pxVar3[iVar4].counts;
      if (__dest == (int *)0x0) {
        __dest = (int *)(*xmlMalloc)((long)iVar2 << 2);
        exec->rollbacks[exec->nbRollbacks].counts = __dest;
        if (__dest == (int *)0x0) goto LAB_00174db2;
        iVar2 = exec->comp->nbCounters;
      }
      memcpy(__dest,exec->counts,(long)iVar2 << 2);
      iVar4 = exec->nbRollbacks;
    }
    exec->nbRollbacks = iVar4 + 1;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar6 = 4;
LAB_00174ceb:
      pxVar3 = (xmlRegExecRollback *)(*xmlRealloc)(exec->rollbacks,(ulong)uVar6 * 0x18);
      if (pxVar3 != (xmlRegExecRollback *)0x0) {
        exec->rollbacks = pxVar3;
        exec->maxRollbacks = uVar6;
        memset(pxVar3 + iVar4,0,(long)(int)(uVar6 - iVar4) * 0x18);
        iVar4 = exec->nbRollbacks;
        goto LAB_00174d2e;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar5 = uVar1 + 1 >> 1;
      uVar6 = uVar5 + uVar1;
      if (1000000000 - uVar5 < uVar1) {
        uVar6 = 1000000000;
      }
      goto LAB_00174ceb;
    }
LAB_00174db2:
    exec->status = -5;
  }
  return;
}

Assistant:

static void
xmlFARegExecSave(xmlRegExecCtxtPtr exec) {
#ifdef MAX_PUSH
    if (exec->nbPush > MAX_PUSH) {
        exec->status = XML_REGEXP_INTERNAL_LIMIT;
        return;
    }
    exec->nbPush++;
#endif

    if (exec->nbRollbacks >= exec->maxRollbacks) {
	xmlRegExecRollback *tmp;
        int newSize;
	int len = exec->nbRollbacks;

        newSize = xmlGrowCapacity(exec->maxRollbacks, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	tmp = xmlRealloc(exec->rollbacks, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	exec->rollbacks = tmp;
	exec->maxRollbacks = newSize;
	tmp = &exec->rollbacks[len];
	memset(tmp, 0, (exec->maxRollbacks - len) * sizeof(xmlRegExecRollback));
    }
    exec->rollbacks[exec->nbRollbacks].state = exec->state;
    exec->rollbacks[exec->nbRollbacks].index = exec->index;
    exec->rollbacks[exec->nbRollbacks].nextbranch = exec->transno + 1;
    if (exec->comp->nbCounters > 0) {
	if (exec->rollbacks[exec->nbRollbacks].counts == NULL) {
	    exec->rollbacks[exec->nbRollbacks].counts = (int *)
		xmlMalloc(exec->comp->nbCounters * sizeof(int));
	    if (exec->rollbacks[exec->nbRollbacks].counts == NULL) {
		exec->status = XML_REGEXP_OUT_OF_MEMORY;
		return;
	    }
	}
	memcpy(exec->rollbacks[exec->nbRollbacks].counts, exec->counts,
	       exec->comp->nbCounters * sizeof(int));
    }
    exec->nbRollbacks++;
}